

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

wchar_t __thiscall CharConvUTF8::readch(CharConvUTF8 *this,CVmDataSource *src)

{
  int iVar1;
  wchar_t wVar2;
  size_t sVar3;
  size_t sVar4;
  char buf [10];
  
  iVar1 = (*src->_vptr_CVmDataSource[2])(src,buf,1);
  if (iVar1 == 0) {
    sVar3 = utf8_ptr::s_charsize(buf[0]);
    if (1 < sVar3) {
      sVar4 = 10;
      if (sVar3 < 10) {
        sVar4 = sVar3;
      }
      iVar1 = (*src->_vptr_CVmDataSource[2])(src,buf + 1,sVar4 - 1);
      if (iVar1 != 0) goto LAB_0029c1ad;
    }
    wVar2 = utf8_ptr::s_getch(buf);
    return wVar2;
  }
LAB_0029c1ad:
  err_throw(0x65);
}

Assistant:

virtual wchar_t readch(CVmDataSource *src)
    {
        /* read the first byte */
        char buf[10];
        if (src->read(buf, 1))
            err_throw(VMERR_READ_FILE);

        /* figure how many more bytes we have to read */
        size_t len = utf8_ptr::s_charsize(buf[0]);
        if (len > sizeof(buf))
            len = sizeof(buf);

        /* read the rest of the bytes */
        if (len > 1 && src->read(buf+1, len-1))
            err_throw(VMERR_READ_FILE);

        /* return the translated character */
        return utf8_ptr::s_getch(buf);
    }